

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_ToArrayLengthFree(JSContext *ctx,uint32_t *plen,JSValue val,BOOL is_array_ctor)

{
  JSValue val_00;
  int iVar1;
  int iVar2;
  uint in_ECX;
  double in_RDX;
  JSContext *in_RSI;
  JSContext *in_RDI;
  int in_R8D;
  double dVar3;
  JSValue JVar4;
  uint32_t len1;
  double d;
  int v;
  uint32_t len;
  uint32_t tag;
  JSValue in_stack_ffffffffffffff88;
  JSValue in_stack_ffffffffffffff98;
  int local_44;
  BOOL in_stack_ffffffffffffffcc;
  undefined4 uVar5;
  undefined4 uVar6;
  
  iVar1 = SUB84(in_RDX,0);
  if (in_ECX < 3) {
    if (iVar1 < 0) {
LAB_001307d8:
      JS_ThrowRangeError(in_RDI,"invalid array length");
      return -1;
    }
  }
  else if (in_ECX == 7) {
    iVar1 = (int)(long)in_RDX;
    dVar3 = (double)((long)in_RDX & 0xffffffff);
    if ((dVar3 != in_RDX) || (NAN(dVar3) || NAN(in_RDX))) goto LAB_001307d8;
  }
  else if (in_R8D == 0) {
    iVar1 = JS_ToUint32((JSContext *)in_stack_ffffffffffffff88.tag,
                        (uint32_t *)in_stack_ffffffffffffff88.u.ptr,in_stack_ffffffffffffff98);
    if (iVar1 != 0) {
      JS_FreeValue((JSContext *)in_stack_ffffffffffffff88.tag,in_stack_ffffffffffffff98);
      return -1;
    }
    JVar4 = JS_ToNumberFree((JSContext *)0x130765,in_stack_ffffffffffffff88);
    uVar5 = JVar4.u._0_4_;
    uVar6 = JVar4.u._4_4_;
    iVar1 = JS_IsException(JVar4);
    if (iVar1 != 0) {
      return -1;
    }
    JVar4.tag._0_4_ = uVar5;
    JVar4.u.ptr = in_RDI;
    JVar4.tag._4_4_ = uVar6;
    iVar1 = JS_ToArrayLengthFree
                      (in_RSI,(uint32_t *)CONCAT44(in_R8D,in_ECX),JVar4,in_stack_ffffffffffffffcc);
    if (iVar1 != 0) {
      return -1;
    }
    iVar1 = in_stack_ffffffffffffffcc;
    if (local_44 != in_stack_ffffffffffffffcc) goto LAB_001307d8;
  }
  else {
    JVar4 = JS_ToNumberFree((JSContext *)0x13069d,in_stack_ffffffffffffff88);
    uVar5 = JVar4.u._0_4_;
    uVar6 = JVar4.u._4_4_;
    iVar1 = JS_IsException(JVar4);
    if (iVar1 != 0) {
      return -1;
    }
    val_00.tag._0_4_ = uVar5;
    val_00.u.ptr = in_RDI;
    val_00.tag._4_4_ = uVar6;
    iVar2 = JS_ToArrayLengthFree
                      (in_RSI,(uint32_t *)CONCAT44(in_R8D,in_ECX),val_00,in_stack_ffffffffffffffcc);
    iVar1 = in_stack_ffffffffffffffcc;
    if (iVar2 != 0) {
      return -1;
    }
  }
  (in_RSI->header).ref_count = iVar1;
  return 0;
}

Assistant:

static __exception int JS_ToArrayLengthFree(JSContext *ctx, uint32_t *plen,
                                            JSValue val, BOOL is_array_ctor)
{
    uint32_t tag, len;

    tag = JS_VALUE_GET_TAG(val);
    switch(tag) {
    case JS_TAG_INT:
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
        {
            int v;
            v = JS_VALUE_GET_INT(val);
            if (v < 0)
                goto fail;
            len = v;
        }
        break;
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
    case JS_TAG_BIG_FLOAT:
        {
            JSBigFloat *p = JS_VALUE_GET_PTR(val);
            bf_t a;
            BOOL res;
            bf_get_int32((int32_t *)&len, &p->num, BF_GET_INT_MOD);
            bf_init(ctx->bf_ctx, &a);
            bf_set_ui(&a, len);
            res = bf_cmp_eq(&a, &p->num);
            bf_delete(&a);
            JS_FreeValue(ctx, val);
            if (!res)
                goto fail;
        }
        break;
#endif
    default:
        if (JS_TAG_IS_FLOAT64(tag)) {
            double d;
            d = JS_VALUE_GET_FLOAT64(val);
            len = (uint32_t)d;
            if (len != d)
                goto fail;
        } else {
            uint32_t len1;

            if (is_array_ctor) {
                val = JS_ToNumberFree(ctx, val);
                if (JS_IsException(val))
                    return -1;
                /* cannot recurse because val is a number */
                if (JS_ToArrayLengthFree(ctx, &len, val, TRUE))
                    return -1;
            } else {
                /* legacy behavior: must do the conversion twice and compare */
                if (JS_ToUint32(ctx, &len, val)) {
                    JS_FreeValue(ctx, val);
                    return -1;
                }
                val = JS_ToNumberFree(ctx, val);
                if (JS_IsException(val))
                    return -1;
                /* cannot recurse because val is a number */
                if (JS_ToArrayLengthFree(ctx, &len1, val, FALSE))
                    return -1;
                if (len1 != len) {
                fail:
                    JS_ThrowRangeError(ctx, "invalid array length");
                    return -1;
                }
            }
        }
        break;
    }
    *plen = len;
    return 0;
}